

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall
dtc::fdt::device_tree::parse_file
          (device_tree *this,text_input_buffer *input,
          vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
          *roots,bool *read_header)

{
  pointer *pppVar1;
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  iterator __position;
  _Elt_pointer psVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  _Elt_pointer psVar6;
  int iVar7;
  _Elt_pointer psVar8;
  vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>> *this_01;
  unsigned_long_long start;
  unsigned_long_long len;
  string ref;
  string local_e8;
  string local_c8;
  shared_ptr<dtc::fdt::node> local_a8;
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *local_98;
  undefined1 local_90 [24];
  size_type sStack_78;
  _Prime_rehash_policy local_70;
  __node_base_ptr p_Stack_60;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_58;
  vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>> *local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  local_50 = (vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
              *)roots;
  text_input_buffer::next_token(input);
  bVar5 = text_input_buffer::consume(input,"/dts-v1/;");
  if (bVar5) {
    do {
      *read_header = true;
      text_input_buffer::next_token(input);
      bVar5 = text_input_buffer::consume(input,"/dts-v1/;");
    } while (bVar5);
  }
  bVar5 = text_input_buffer::consume(input,"/plugin/;");
  if (bVar5) {
    this->is_plugin = true;
  }
  text_input_buffer::next_token(input);
  if (*read_header == false) {
    text_input_buffer::parse_error(input,"Expected /dts-v1/; version string");
  }
  bVar5 = text_input_buffer::consume(input,"/memreserve/");
  if (bVar5) {
    local_58 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->reservations;
    local_98 = &input->input_stack;
    do {
      text_input_buffer::next_token(input);
      bVar5 = text_input_buffer::consume_integer_expression(input,(unsigned_long_long *)&local_e8);
      if (bVar5) {
        text_input_buffer::next_token(input);
        bVar5 = text_input_buffer::consume_integer_expression(input,(unsigned_long_long *)&local_c8)
        ;
        if (!bVar5) goto LAB_00127424;
        local_90._0_8_ = local_e8._M_dataplus._M_p;
        local_90._8_8_ = local_c8._M_dataplus._M_p;
        __position._M_current =
             (this->reservations).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->reservations).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    (local_58,__position,(pair<unsigned_long,_unsigned_long> *)local_90);
        }
        else {
          (__position._M_current)->first = (unsigned_long)local_e8._M_dataplus._M_p;
          (__position._M_current)->second = (unsigned_long)local_c8._M_dataplus._M_p;
          pppVar1 = &(this->reservations).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
      else {
LAB_00127424:
        text_input_buffer::parse_error(input,"Expected size on /memreserve/ node.");
      }
      text_input_buffer::next_token(input);
      psVar6 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar6 != (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        psVar2 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        psVar8 = psVar6;
        if (psVar6 == psVar2) {
          psVar8 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar7 = peVar3->cursor;
        if (((-1 < (long)iVar7) && (iVar7 < peVar3->size)) && (peVar3->buffer[iVar7] == ';')) {
          input->cursor = input->cursor + 1;
          if (psVar6 == psVar2) {
            psVar6 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar7 = peVar3->cursor + 1;
          peVar3->cursor = iVar7;
          if (peVar3->size <= iVar7) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&local_98->c);
          }
        }
      }
      text_input_buffer::next_token(input);
      bVar5 = text_input_buffer::consume(input,"/memreserve/");
    } while (bVar5);
  }
  if (this->valid == true) {
    this_00 = &input->input_stack;
    local_98 = (stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
                *)&this->defines;
    local_58 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->deletions;
    this_01 = local_50;
    do {
      bVar5 = text_input_buffer::finished(input);
      if (bVar5) {
        return;
      }
      local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar5 = text_input_buffer::consume(input,"/delete-node/");
      if (bVar5) {
        text_input_buffer::next_token(input);
        psVar6 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar6 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00127774:
          text_input_buffer::parse_error(input,"Expected reference after top-level /delete-node/.");
          this->valid = false;
        }
        else {
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar8 = psVar6;
          if (psVar6 == psVar2) {
            psVar8 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar7 = peVar3->cursor;
          if ((((long)iVar7 < 0) || (peVar3->size <= iVar7)) || (peVar3->buffer[iVar7] != '&'))
          goto LAB_00127774;
          input->cursor = input->cursor + 1;
          if (psVar6 == psVar2) {
            psVar6 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar7 = peVar3->cursor + 1;
          peVar3->cursor = iVar7;
          if (peVar3->size <= iVar7) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&this_00->c);
          }
        }
        text_input_buffer::next_token(input);
        if (this->valid == true) {
          text_input_buffer::parse_node_name_abi_cxx11_((string *)local_90,input);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._8_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            text_input_buffer::parse_error(input,"Expected label name for top-level /delete-node/.")
            ;
            this->valid = false;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_90);
          }
          psVar6 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar6 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00127a9a:
            text_input_buffer::parse_error(input,"Missing semicolon.");
            this->valid = false;
          }
          else {
            psVar2 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
            psVar8 = psVar6;
            if (psVar6 == psVar2) {
              psVar8 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar3->cursor;
            if ((((long)iVar7 < 0) || (peVar3->size <= iVar7)) || (peVar3->buffer[iVar7] != ';'))
            goto LAB_00127a9a;
            input->cursor = input->cursor + 1;
            if (psVar6 == psVar2) {
              psVar6 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar3->cursor + 1;
            peVar3->cursor = iVar7;
            if (peVar3->size <= iVar7) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          text_input_buffer::next_token(input);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_90._16_8_ + 1));
          }
        }
      }
      else {
        psVar6 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar6 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_001279d0:
          text_input_buffer::parse_error(input,"Failed to find root node /.");
        }
        else {
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar8 = psVar6;
          if (psVar6 == psVar2) {
            psVar8 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar7 = peVar3->cursor;
          if ((((long)iVar7 < 0) || (peVar3->size <= iVar7)) || (peVar3->buffer[iVar7] != '/')) {
            psVar2 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
            psVar8 = psVar6;
            if (psVar6 == psVar2) {
              psVar8 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar3->cursor;
            if ((((long)iVar7 < 0) || (peVar3->size <= iVar7)) || (peVar3->buffer[iVar7] != '&'))
            goto LAB_001279d0;
            input->cursor = input->cursor + 1;
            if (psVar6 == psVar2) {
              psVar6 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar3->cursor + 1;
            peVar3->cursor = iVar7;
            if (peVar3->size <= iVar7) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
            text_input_buffer::next_token(input);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8._M_string_length = 0;
            local_e8.field_2._M_local_buf[0] = '\0';
            psVar6 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar6 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00127af1:
              text_input_buffer::parse_node_name_abi_cxx11_((string *)local_90,input);
              std::__cxx11::string::operator=((string *)&local_e8,(string *)local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_90 + 0x10)) {
                operator_delete((void *)local_90._0_8_,
                                (ulong)((long)(_Hash_node_base **)local_90._16_8_ + 1));
              }
              bVar5 = false;
            }
            else {
              psVar2 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first;
              psVar8 = psVar6;
              if (psVar6 == psVar2) {
                psVar8 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar3->cursor;
              if ((((long)iVar7 < 0) || (peVar3->size <= iVar7)) || (peVar3->buffer[iVar7] != '{'))
              goto LAB_00127af1;
              input->cursor = input->cursor + 1;
              if (psVar6 == psVar2) {
                psVar6 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar3 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar7 = peVar3->cursor + 1;
              peVar3->cursor = iVar7;
              if (peVar3->size <= iVar7) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
              if (this->is_plugin != true) goto LAB_00127af1;
              text_input_buffer::parse_to_abi_cxx11_((string *)local_90,input,'}');
              std::__cxx11::string::operator=((string *)&local_e8,(string *)local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_90 + 0x10)) {
                operator_delete((void *)local_90._0_8_,
                                (ulong)((long)(_Hash_node_base **)local_90._16_8_ + 1));
              }
              psVar6 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              bVar5 = true;
              if (psVar6 != (input->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                psVar2 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first;
                psVar8 = psVar6;
                if (psVar6 == psVar2) {
                  psVar8 = (input->input_stack).c.
                           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                peVar3 = psVar8[-1].
                         super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar7 = peVar3->cursor;
                if (((-1 < (long)iVar7) && (iVar7 < peVar3->size)) && (peVar3->buffer[iVar7] == '}')
                   ) {
                  input->cursor = input->cursor + 1;
                  if (psVar6 == psVar2) {
                    psVar6 = (input->input_stack).c.
                             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                  }
                  peVar3 = psVar6[-1].
                           super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  iVar7 = peVar3->cursor + 1;
                  peVar3->cursor = iVar7;
                  if (peVar3->size <= iVar7) {
                    std::
                    deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ::pop_back(&this_00->c);
                  }
                }
              }
            }
            text_input_buffer::next_token(input);
            local_90._0_8_ = local_90 + 0x30;
            local_90._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            local_90._16_8_ = (_Hash_node_base *)0x0;
            sStack_78 = 0;
            local_70._M_max_load_factor = 1.0;
            local_70._4_4_ = 0;
            local_70._M_next_resize = 0;
            p_Stack_60 = (__node_base_ptr)0x0;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8._M_string_length = 0;
            local_c8.field_2._M_local_buf[0] = '\0';
            node::parse((node *)&stack0xffffffffffffffb8,input,this,&local_e8,(string_set *)local_90
                        ,&local_c8,(define_map *)local_98);
            _Var4._M_pi = local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_48;
            local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Stack_40;
            if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                       local_c8.field_2._M_local_buf[0]) + 1);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_90);
            if (local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              (local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              name_is_path_reference = bVar5;
            }
            this_01 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                       local_e8.field_2._M_local_buf[0]) + 1);
              this_01 = local_50;
            }
          }
          else {
            input->cursor = input->cursor + 1;
            if (psVar6 == psVar2) {
              psVar6 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar6[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = peVar3->cursor + 1;
            peVar3->cursor = iVar7;
            if (peVar3->size <= iVar7) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
            text_input_buffer::next_token(input);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8._M_string_length = 0;
            local_e8.field_2._M_local_buf[0] = '\0';
            local_90._0_8_ = local_90 + 0x30;
            local_90._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            local_90._16_8_ = (_Hash_node_base *)0x0;
            sStack_78 = 0;
            local_70._M_max_load_factor = 1.0;
            local_70._4_4_ = 0;
            local_70._M_next_resize = 0;
            p_Stack_60 = (__node_base_ptr)0x0;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8._M_string_length = 0;
            local_c8.field_2._M_local_buf[0] = '\0';
            node::parse((node *)&stack0xffffffffffffffb8,input,this,&local_e8,(string_set *)local_90
                        ,&local_c8,(define_map *)local_98);
            _Var4._M_pi = local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_48;
            local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = p_Stack_40;
            if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,
                              CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                       local_c8.field_2._M_local_buf[0]) + 1);
            }
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                       local_e8.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        if (local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          this->valid = false;
        }
        else {
          std::
          vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>::
          emplace_back<std::shared_ptr<dtc::fdt::node>>(this_01,&local_a8);
        }
        text_input_buffer::next_token(input);
      }
      if (local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while (this->valid != false);
  }
  return;
}

Assistant:

void
device_tree::parse_file(text_input_buffer &input,
                        std::vector<node_ptr> &roots,
                        bool &read_header)
{
	input.next_token();
	// Read the header
	while (input.consume("/dts-v1/;"))
	{
		read_header = true;
		input.next_token();
	}
	if (input.consume("/plugin/;"))
	{
		is_plugin = true;
	}
	input.next_token();
	if (!read_header)
	{
		input.parse_error("Expected /dts-v1/; version string");
	}
	// Read any memory reservations
	while (input.consume("/memreserve/"))
	{
		unsigned long long start, len;
		input.next_token();
		// Read the start and length.
		if (!(input.consume_integer_expression(start) &&
		    (input.next_token(),
		    input.consume_integer_expression(len))))
		{
			input.parse_error("Expected size on /memreserve/ node.");
		}
		else
		{
			reservations.push_back(reservation(start, len));
		}
		input.next_token();
		input.consume(';');
		input.next_token();
	}
	while (valid && !input.finished())
	{
		node_ptr n;
		if (input.consume("/delete-node/"))
		{
			// Top-level /delete-node/ directives refer to references that must
			// be deleted later.
			input.next_token();
			auto expect = [&](auto token, const char *msg)
			{
				if (!input.consume(token))
				{
					input.parse_error(msg);
					valid = false;
				}
				input.next_token();
				return valid;
			};
			if (expect('&', "Expected reference after top-level /delete-node/."))
			{
				string ref = input.parse_node_name();
				if (ref == string())
				{
					input.parse_error("Expected label name for top-level /delete-node/.");
					valid = false;
				}
				else
				{
					deletions.push_back(std::move(ref));
				}
				expect(';', "Missing semicolon.");
			}
			continue;
		}
		else if (input.consume('/'))
		{
			input.next_token();
			n = node::parse(input, *this, string(), string_set(), string(), &defines);
		}
		else if (input.consume('&'))
		{
			input.next_token();
			string name;
			bool name_is_path_reference = false;
			// This is to deal with names intended as path references, e.g. &{/path}.
			// While it may make sense in a non-plugin context, we don't support such
			// usage at this time.
			if (input.consume('{') && is_plugin)
			{
				name = input.parse_to('}');
				input.consume('}');
				name_is_path_reference = true;
			}
			else
			{
				name = input.parse_node_name();
			}
			input.next_token();
			n = node::parse(input, *this, std::move(name), string_set(), string(), &defines);
			if (n)
			{
				n->name_is_path_reference = name_is_path_reference;
			}
		}
		else
		{
			input.parse_error("Failed to find root node /.");
		}
		if (n)
		{
			roots.push_back(std::move(n));
		}
		else
		{
			valid = false;
		}
		input.next_token();
	}
}